

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int VP8EncTokenLoop(VP8Encoder *enc)

{
  long lVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  long *in_RDI;
  bool bVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  uint64_t size;
  VP8ModeScore info;
  int pass_progress;
  int cnt;
  uint64_t distortion;
  uint64_t size_p0;
  int is_last_pass;
  int ok;
  PassStats stats;
  uint64_t pixel_count;
  VP8RDLevel rd_opt;
  VP8EncProba *proba;
  VP8EncIterator it;
  int do_search;
  int remaining_progress;
  int num_pass_left;
  int max_count;
  uint in_stack_ffffffffffffece8;
  undefined1 in_stack_ffffffffffffecec;
  undefined1 in_stack_ffffffffffffeced;
  undefined1 in_stack_ffffffffffffecee;
  undefined1 uVar9;
  VP8Encoder *in_stack_ffffffffffffecf0;
  VP8Encoder *in_stack_ffffffffffffecf8;
  undefined4 in_stack_ffffffffffffed00;
  int in_stack_ffffffffffffed04;
  VP8EncIterator *in_stack_ffffffffffffed08;
  VP8Encoder *in_stack_ffffffffffffed10;
  undefined4 in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed1c;
  VP8EncProba *in_stack_ffffffffffffed20;
  VP8BitWriter *in_stack_ffffffffffffed28;
  VP8EncProba *in_stack_ffffffffffffed30;
  VP8EncIterator *in_stack_ffffffffffffed40;
  VP8ModeScore *in_stack_ffffffffffffed48;
  VP8EncIterator *in_stack_ffffffffffffed50;
  int local_f94;
  uint8_t *local_f88;
  int local_f7c;
  float local_f74;
  int local_f48;
  VP8EncIterator local_f28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long *local_10;
  int local_4;
  
  local_14 = (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) >> 3;
  local_18 = *(int *)(*in_RDI + 0x3c);
  local_1c = 0x28;
  local_20 = *(int *)((long)in_RDI + 0x5c54);
  local_10 = in_RDI;
  InitPassStats(in_stack_ffffffffffffed10,(PassStats *)in_stack_ffffffffffffed08);
  local_f7c = PreLoopInitialize(in_stack_ffffffffffffecf8);
  if (local_f7c == 0) {
    local_4 = 0;
  }
  else {
    if (local_14 < 0x60) {
      local_14 = 0x60;
    }
    while( true ) {
      iVar2 = local_18;
      bVar5 = local_f7c != 0;
      if (bVar5) {
        local_18 = local_18 + -1;
      }
      uVar9 = bVar5 && 0 < iVar2;
      if (!bVar5 || 0 >= iVar2) break;
      auVar8._8_8_ = in_XMM1._8_8_;
      auVar8._0_8_ = (double)local_f74;
      in_XMM1 = auVar8 & _DAT_001e6200;
      bVar5 = true;
      if ((0.4 < in_XMM1._0_8_) && (bVar5 = true, local_18 != 0)) {
        bVar5 = (int)local_10[0xb89] == 0;
      }
      local_f88 = (uint8_t *)0x0;
      local_f94 = local_14;
      local_1c = local_1c - local_1c / (local_18 + 2);
      in_stack_ffffffffffffecee = bVar5;
      VP8IteratorInit(in_stack_ffffffffffffecf0,
                      (VP8EncIterator *)
                      CONCAT17(uVar9,CONCAT16(bVar5,CONCAT15(in_stack_ffffffffffffeced,
                                                             CONCAT14(in_stack_ffffffffffffecec,
                                                                      in_stack_ffffffffffffece8)))))
      ;
      SetLoopParams(in_stack_ffffffffffffecf0,
                    (float)CONCAT13(uVar9,CONCAT12(in_stack_ffffffffffffecee,
                                                   CONCAT11(in_stack_ffffffffffffeced,
                                                            in_stack_ffffffffffffecec))));
      if (bVar5 != false) {
        ResetTokenStats(in_stack_ffffffffffffecf0);
        VP8InitFilter((VP8EncIterator *)in_stack_ffffffffffffecf0);
      }
      VP8TBufferClear((VP8TBuffer *)in_stack_ffffffffffffecf0);
      do {
        VP8IteratorImport((VP8EncIterator *)in_stack_ffffffffffffed30,
                          (uint8_t *)in_stack_ffffffffffffed28);
        local_f94 = local_f94 + -1;
        if (local_f94 < 0) {
          FinalizeTokenProbas(in_stack_ffffffffffffed30);
          VP8CalculateLevelCosts(in_stack_ffffffffffffed20);
          local_f94 = local_14;
        }
        VP8Decimate((VP8EncIterator *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                    (VP8ModeScore *)in_stack_ffffffffffffecf8,
                    (VP8RDLevel)((ulong)in_stack_ffffffffffffecf0 >> 0x20));
        local_f7c = RecordTokens(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
                                 (VP8TBuffer *)in_stack_ffffffffffffed40);
        if (local_f7c == 0) {
          WebPEncodingSetError((WebPPicture *)local_10[1],VP8_ENC_ERROR_OUT_OF_MEMORY);
          break;
        }
        local_f88 = in_stack_ffffffffffffed08->i4_boundary + (long)(local_f88 + -0x50);
        if (bVar5 != false) {
          StoreSideInfo((VP8EncIterator *)in_stack_ffffffffffffed20);
          VP8StoreFilterStats((VP8EncIterator *)in_stack_ffffffffffffed10);
          VP8IteratorExport(in_stack_ffffffffffffed40);
          local_f7c = VP8IteratorProgress(in_stack_ffffffffffffed08,in_stack_ffffffffffffed04);
        }
        VP8IteratorSaveBoundary(&local_f28);
        in_stack_ffffffffffffeced = false;
        if (local_f7c != 0) {
          iVar2 = VP8IteratorNext((VP8EncIterator *)0x1a2ff1);
          in_stack_ffffffffffffeced = iVar2 != 0;
        }
      } while ((bool)in_stack_ffffffffffffeced != false);
      if (local_f7c == 0) break;
      lVar1 = local_10[5];
      if (local_f48 == 0) {
        GetPSNR((uint64_t)in_stack_ffffffffffffecf0,
                CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffecee,
                                        CONCAT15(in_stack_ffffffffffffeced,
                                                 CONCAT14(in_stack_ffffffffffffecec,
                                                          in_stack_ffffffffffffece8)))));
      }
      else {
        iVar2 = FinalizeTokenProbas(in_stack_ffffffffffffed30);
        lVar3 = (long)iVar2;
        sVar4 = VP8EstimateTokenSize
                          ((VP8TBuffer *)in_stack_ffffffffffffed20,
                           (uint8_t *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18))
        ;
        in_stack_ffffffffffffecf0 =
             (VP8Encoder *)(((ulong)(local_f88 + (int)lVar1 + lVar3 + sVar4 + 0x400) >> 0xb) + 0x1e)
        ;
        auVar6._8_4_ = (int)((ulong)in_stack_ffffffffffffecf0 >> 0x20);
        auVar6._0_8_ = in_stack_ffffffffffffecf0;
        auVar6._12_4_ = 0x45300000;
        dVar7 = auVar6._8_8_ - 1.9342813113834067e+25;
        in_XMM1._8_4_ = SUB84(dVar7,0);
        in_XMM1._0_8_ =
             (double)CONCAT44(0x43300000,(int)in_stack_ffffffffffffecf0) - 4503599627370496.0;
        in_XMM1._12_4_ = (int)((ulong)dVar7 >> 0x20);
      }
      if (((int)local_10[0xb89] < 1) || (local_f88 + (int)lVar1 < (uint8_t *)0x3fc00001)) {
        if (bVar5 != false) break;
        if (local_20 != 0) {
          ComputeNextQ((PassStats *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00));
        }
      }
      else {
        local_18 = local_18 + 1;
        *(int *)(local_10 + 0xb89) = (int)local_10[0xb89] >> 1;
        if (bVar5 != false) {
          ResetSideInfo((VP8EncIterator *)in_stack_ffffffffffffecf0);
        }
      }
    }
    iVar2 = (int)((ulong)in_stack_ffffffffffffecf0 >> 0x20);
    if (local_f7c != 0) {
      if (local_f48 == 0) {
        FinalizeTokenProbas(in_stack_ffffffffffffed30);
      }
      local_f7c = VP8EmitTokens((VP8TBuffer *)in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,
                                in_stack_ffffffffffffed20->segments,in_stack_ffffffffffffed1c);
    }
    if (local_f7c != 0) {
      WebPReportProgress((WebPPicture *)in_stack_ffffffffffffecf8,iVar2,
                         (int *)CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffecee,
                                                        CONCAT15(in_stack_ffffffffffffeced,
                                                                 (uint5)in_stack_ffffffffffffece8)))
                        );
    }
    local_4 = PostLoopFinalize(in_stack_ffffffffffffed08,in_stack_ffffffffffffed04);
  }
  return local_4;
}

Assistant:

int VP8EncTokenLoop(VP8Encoder* const enc) {
  // Roughly refresh the proba eight times per pass
  int max_count = (enc->mb_w * enc->mb_h) >> 3;
  int num_pass_left = enc->config->pass;
  int remaining_progress = 40;  // percents
  const int do_search = enc->do_search;
  VP8EncIterator it;
  VP8EncProba* const proba = &enc->proba;
  const VP8RDLevel rd_opt = enc->rd_opt_level;
  const uint64_t pixel_count = (uint64_t)enc->mb_w * enc->mb_h * 384;
  PassStats stats;
  int ok;

  InitPassStats(enc, &stats);
  ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  if (max_count < MIN_COUNT) max_count = MIN_COUNT;

  assert(enc->num_parts == 1);
  assert(enc->use_tokens);
  assert(proba->use_skip_proba == 0);
  assert(rd_opt >= RD_OPT_BASIC);   // otherwise, token-buffer won't be useful
  assert(num_pass_left > 0);

  while (ok && num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits == 0);
    uint64_t size_p0 = 0;
    uint64_t distortion = 0;
    int cnt = max_count;
    // The final number of passes is not trivial to know in advance.
    const int pass_progress = remaining_progress / (2 + num_pass_left);
    remaining_progress -= pass_progress;
    VP8IteratorInit(enc, &it);
    SetLoopParams(enc, stats.q);
    if (is_last_pass) {
      ResetTokenStats(enc);
      VP8InitFilter(&it);  // don't collect stats until last pass (too costly)
    }
    VP8TBufferClear(&enc->tokens);
    do {
      VP8ModeScore info;
      VP8IteratorImport(&it, NULL);
      if (--cnt < 0) {
        FinalizeTokenProbas(proba);
        VP8CalculateLevelCosts(proba);  // refresh cost tables for rd-opt
        cnt = max_count;
      }
      VP8Decimate(&it, &info, rd_opt);
      ok = RecordTokens(&it, &info, &enc->tokens);
      if (!ok) {
        WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        break;
      }
      size_p0 += info.H;
      distortion += info.D;
      if (is_last_pass) {
        StoreSideInfo(&it);
        VP8StoreFilterStats(&it);
        VP8IteratorExport(&it);
        ok = VP8IteratorProgress(&it, pass_progress);
      }
      VP8IteratorSaveBoundary(&it);
    } while (ok && VP8IteratorNext(&it));
    if (!ok) break;

    size_p0 += enc->segment_hdr.size;
    if (stats.do_size_search) {
      uint64_t size = FinalizeTokenProbas(&enc->proba);
      size += VP8EstimateTokenSize(&enc->tokens,
                                   (const uint8_t*)proba->coeffs);
      size = (size + size_p0 + 1024) >> 11;  // -> size in bytes
      size += HEADER_SIZE_ESTIMATE;
      stats.value = (double)size;
    } else {  // compute and store PSNR
      stats.value = GetPSNR(distortion, pixel_count);
    }

#if (DEBUG_SEARCH > 0)
    printf("#%2d metric:%.1lf -> %.1lf   last_q=%.2lf q=%.2lf dq=%.2lf "
           " range:[%.1f, %.1f]\n",
           num_pass_left, stats.last_value, stats.value,
           stats.last_q, stats.q, stats.dq, stats.qmin, stats.qmax);
#endif
    if (enc->max_i4_header_bits > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits >>= 1;  // strengthen header bit limitation...
      if (is_last_pass) {
        ResetSideInfo(&it);
      }
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;   // done
    }
    if (do_search) {
      ComputeNextQ(&stats);  // Adjust q
    }
  }
  if (ok) {
    if (!stats.do_size_search) {
      FinalizeTokenProbas(&enc->proba);
    }
    ok = VP8EmitTokens(&enc->tokens, enc->parts + 0,
                       (const uint8_t*)proba->coeffs, 1);
  }
  ok = ok && WebPReportProgress(enc->pic, enc->percent + remaining_progress,
                                &enc->percent);
  return PostLoopFinalize(&it, ok);
}